

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::DeviceMemory>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  Resources *this_00;
  RefData<vk::Handle<(vk::HandleType)7>_> data;
  RefData<vk::Handle<(vk::HandleType)7>_> data_00;
  RefData<vk::Handle<(vk::HandleType)7>_> data_01;
  RefData<vk::Handle<(vk::HandleType)7>_> data_02;
  allocator<char> local_219;
  string local_218;
  Move<vk::Handle<(vk::HandleType)7>_> local_1f8;
  RefData<vk::Handle<(vk::HandleType)7>_> local_1d8;
  undefined1 local_1b8 [8];
  Unique<vk::Handle<(vk::HandleType)7>_> obj3;
  RefData<vk::Handle<(vk::HandleType)7>_> local_178;
  undefined1 local_158 [8];
  Unique<vk::Handle<(vk::HandleType)7>_> obj2;
  RefData<vk::Handle<(vk::HandleType)7>_> local_118;
  undefined1 local_f8 [8];
  Unique<vk::Handle<(vk::HandleType)7>_> obj1;
  Move<vk::Handle<(vk::HandleType)7>_> local_c8;
  RefData<vk::Handle<(vk::HandleType)7>_> local_a8;
  undefined1 local_88 [8];
  Unique<vk::Handle<(vk::HandleType)7>_> obj0;
  undefined1 local_60 [7];
  Resources res;
  Environment env;
  Context *context_local;
  Parameters params_local;
  
  params_local.size._0_4_ = (undefined4)params.size;
  context_local = context;
  params_local._8_8_ = __return_storage_ptr__;
  Environment::Environment((Environment *)local_60,(Context *)this,4);
  this_00 = (Resources *)
            ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator +
            7);
  DeviceMemory::Resources::Resources(this_00,(Environment *)local_60,(Parameters *)&context_local);
  DeviceMemory::create(&local_c8,(Environment *)local_60,this_00,(Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a8,(Move *)&local_c8);
  data.deleter.m_deviceIface = local_a8.deleter.m_deviceIface;
  data.object.m_internal = local_a8.object.m_internal;
  data.deleter.m_device = local_a8.deleter.m_device;
  data.deleter.m_allocator = local_a8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_88,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_c8);
  DeviceMemory::create
            ((Move<vk::Handle<(vk::HandleType)7>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator,
             (Environment *)local_60,
             (Resources *)
             ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator +
             7),(Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_118,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator)
  ;
  data_00.deleter.m_deviceIface = local_118.deleter.m_deviceIface;
  data_00.object.m_internal = local_118.object.m_internal;
  data_00.deleter.m_device = local_118.deleter.m_device;
  data_00.deleter.m_allocator = local_118.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_f8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)7>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator);
  DeviceMemory::create
            ((Move<vk::Handle<(vk::HandleType)7>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator,
             (Environment *)local_60,
             (Resources *)
             ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator +
             7),(Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_178,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator)
  ;
  data_01.deleter.m_deviceIface = local_178.deleter.m_deviceIface;
  data_01.object.m_internal = local_178.object.m_internal;
  data_01.deleter.m_device = local_178.deleter.m_device;
  data_01.deleter.m_allocator = local_178.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_158,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)7>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator);
  DeviceMemory::create
            (&local_1f8,(Environment *)local_60,
             (Resources *)
             ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator +
             7),(Parameters *)&context_local);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1d8,(Move *)&local_1f8);
  data_02.deleter.m_deviceIface = local_1d8.deleter.m_deviceIface;
  data_02.object.m_internal = local_1d8.object.m_internal;
  data_02.deleter.m_device = local_1d8.deleter.m_device;
  data_02.deleter.m_allocator = local_1d8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_1b8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_1f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_1b8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_158);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)7>_> *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"Ok",&local_219);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}